

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateRecorder::get_hash_for_pipeline_library_handle
          (StateRecorder *this,VkPipeline pipeline,Hash *hash)

{
  Impl *pIVar1;
  ulong uVar2;
  bool bVar3;
  _Hash_node_base *p_Var4;
  ulong uVar5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  long *in_FS_OFFSET;
  
  pIVar1 = this->impl;
  uVar2 = (pIVar1->raytracing_pipeline_to_hash)._M_h._M_bucket_count;
  uVar5 = (ulong)pipeline % uVar2;
  p_Var6 = (pIVar1->raytracing_pipeline_to_hash)._M_h._M_buckets[uVar5];
  p_Var7 = (__node_base_ptr)0x0;
  if ((p_Var6 != (__node_base_ptr)0x0) &&
     (p_Var4 = p_Var6->_M_nxt, p_Var7 = p_Var6, (VkPipeline)p_Var6->_M_nxt[1]._M_nxt != pipeline)) {
    while (p_Var6 = p_Var4, p_Var4 = p_Var6->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
      p_Var7 = (__node_base_ptr)0x0;
      if (((ulong)p_Var4[1]._M_nxt % uVar2 != uVar5) ||
         (p_Var7 = p_Var6, (VkPipeline)p_Var4[1]._M_nxt == pipeline)) goto LAB_00125835;
    }
    p_Var7 = (__node_base_ptr)0x0;
  }
LAB_00125835:
  if (p_Var7 == (__node_base_ptr)0x0) {
    p_Var4 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var4 = p_Var7->_M_nxt;
  }
  if (p_Var4 == (_Hash_node_base *)0x0) {
    uVar2 = (pIVar1->graphics_pipeline_to_hash)._M_h._M_bucket_count;
    uVar5 = (ulong)pipeline % uVar2;
    p_Var6 = (pIVar1->graphics_pipeline_to_hash)._M_h._M_buckets[uVar5];
    p_Var7 = (__node_base_ptr)0x0;
    if ((p_Var6 != (__node_base_ptr)0x0) &&
       (p_Var4 = p_Var6->_M_nxt, p_Var7 = p_Var6, (VkPipeline)p_Var6->_M_nxt[1]._M_nxt != pipeline))
    {
      while (p_Var6 = p_Var4, p_Var4 = p_Var6->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
        p_Var7 = (__node_base_ptr)0x0;
        if (((ulong)p_Var4[1]._M_nxt % uVar2 != uVar5) ||
           (p_Var7 = p_Var6, (VkPipeline)p_Var4[1]._M_nxt == pipeline)) goto LAB_001258a6;
      }
      p_Var7 = (__node_base_ptr)0x0;
    }
LAB_001258a6:
    if (p_Var7 == (__node_base_ptr)0x0) {
      p_Var4 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var4 = p_Var7->_M_nxt;
    }
    if (p_Var4 == (_Hash_node_base *)0x0) {
      if (1 < *(int *)(*in_FS_OFFSET + -0x18)) {
        return false;
      }
      bVar3 = Internal::log_thread_callback
                        (LOG_DEFAULT,
                         "%s handle 0x%016lx is not registered.\nIt has either not been recorded, or it failed to be recorded earlier (which is expected if application uses an extension that is not recognized by Fossilize).\n"
                         ,"Pipeline library",pipeline);
      if (bVar3) {
        return false;
      }
      fprintf(_stderr,
              "Fossilize WARN: %s handle 0x%016lx is not registered.\nIt has either not been recorded, or it failed to be recorded earlier (which is expected if application uses an extension that is not recognized by Fossilize).\n"
              ,"Pipeline library",pipeline);
      return false;
    }
  }
  *hash = (Hash)p_Var4[2]._M_nxt;
  return true;
}

Assistant:

bool StateRecorder::get_hash_for_pipeline_library_handle(VkPipeline pipeline, Hash *hash) const
{
	auto itr = impl->raytracing_pipeline_to_hash.find(pipeline);
	if (itr != end(impl->raytracing_pipeline_to_hash))
	{
		*hash = itr->second;
		return true;
	}

	itr = impl->graphics_pipeline_to_hash.find(pipeline);
	if (itr != end(impl->graphics_pipeline_to_hash))
	{
		*hash = itr->second;
		return true;
	}

	log_failed_hash("Pipeline library", pipeline);
	return false;
}